

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.hpp
# Opt level: O1

int __thiscall
nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::compare
          (basic_string_view<char,_std::char_traits<char>_> *this,size_type pos1,size_type n1,
          basic_string_view<char,_std::char_traits<char>_> *other)

{
  ulong uVar1;
  uint uVar2;
  size_type __n;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  substr(&local_20,(size_type)this,pos1);
  uVar1 = other->size_;
  __n = local_20.size_;
  if (uVar1 < local_20.size_) {
    __n = uVar1;
  }
  uVar2 = memcmp(local_20.data_,other->data_,__n);
  if ((uVar2 == 0) && (uVar2 = 0, local_20.size_ != uVar1)) {
    uVar2 = -(uint)(local_20.size_ < uVar1) | 1;
  }
  return uVar2;
}

Assistant:

nssv_constexpr int compare( size_type pos1, size_type n1, basic_string_view other ) const // (2)
    {
        return substr( pos1, n1 ).compare( other );
    }